

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_FindMatchingFont(uchar *fontdata,char *name,int flags)

{
  int iVar1;
  int flags_local;
  char *name_local;
  uchar *fontdata_local;
  
  iVar1 = stbtt_FindMatchingFont_internal(fontdata,name,flags);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *fontdata, const char *name, int flags)
{
   return stbtt_FindMatchingFont_internal((unsigned char *) fontdata, (char *) name, flags);
}